

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_transaction.cpp
# Opt level: O2

ErrorData * __thiscall
duckdb::MetaTransaction::Commit(ErrorData *__return_storage_ptr__,MetaTransaction *this)

{
  AttachedDatabase *this_00;
  reference pvVar1;
  iterator iVar2;
  TransactionManager *pTVar3;
  InternalException *this_01;
  size_type __n;
  allocator local_c1;
  ErrorData *local_c0;
  MetaTransaction *local_b8;
  AttachedDatabase *local_b0 [16];
  
  local_c0 = __return_storage_ptr__;
  ErrorData::ErrorData(__return_storage_ptr__);
  __n = (long)(this->all_transactions).
              super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->all_transactions).
              super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
              .
              super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3;
  local_b8 = this;
  while( true ) {
    __n = __n - 1;
    if (__n == 0xffffffffffffffff) {
      return local_c0;
    }
    pvVar1 = vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true>::get<true>
                       (&this->all_transactions,__n);
    this_00 = pvVar1->_M_data;
    local_b0[0] = this_00;
    iVar2 = ::std::
            _Hashtable<std::reference_wrapper<duckdb::AttachedDatabase>,_std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>_>,_std::__detail::_Select1st,_duckdb::ReferenceEquality<duckdb::AttachedDatabase>,_duckdb::ReferenceHashFunction<duckdb::AttachedDatabase>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->transactions)._M_h,(key_type *)local_b0);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>,_true>
        ._M_cur == (__node_type *)0x0) break;
    pTVar3 = AttachedDatabase::GetTransactionManager(this_00);
    if (local_c0->initialized == false) {
      (*pTVar3->_vptr_TransactionManager[3])((ErrorData *)local_b0,pTVar3,local_b8->context);
      ErrorData::operator=(local_c0,(ErrorData *)local_b0);
      ErrorData::~ErrorData((ErrorData *)local_b0);
    }
    else {
      (*pTVar3->_vptr_TransactionManager[4])
                (pTVar3,*(undefined8 *)
                         ((long)iVar2.
                                super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::AttachedDatabase>,_std::reference_wrapper<duckdb::Transaction>_>,_true>
                                ._M_cur + 0x10));
    }
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)local_b0,
             "Could not find transaction corresponding to database in MetaTransaction",&local_c1);
  InternalException::InternalException(this_01,(string *)local_b0);
  __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

ErrorData MetaTransaction::Commit() {
	ErrorData error;
#ifdef DEBUG
	reference_set_t<AttachedDatabase> committed_tx;
#endif
	// commit transactions in reverse order
	for (idx_t i = all_transactions.size(); i > 0; i--) {
		auto &db = all_transactions[i - 1].get();
		auto entry = transactions.find(db);
		if (entry == transactions.end()) {
			throw InternalException("Could not find transaction corresponding to database in MetaTransaction");
		}
#ifdef DEBUG
		auto already_committed = committed_tx.insert(db).second == false;
		if (already_committed) {
			throw InternalException("All databases inside all_transactions should be unique, invariant broken!");
		}
#endif
		auto &transaction_manager = db.GetTransactionManager();
		auto &transaction = entry->second.get();
		if (!error.HasError()) {
			// commit
			error = transaction_manager.CommitTransaction(context, transaction);
		} else {
			// we have encountered an error previously - roll back subsequent entries
			transaction_manager.RollbackTransaction(transaction);
		}
	}
	return error;
}